

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aho-corasick-lite.cpp
# Opt level: O0

bool __thiscall
Trie::matchAll(Trie *this,string *src,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *outVect)

{
  bool bVar1;
  reference puVar2;
  long in_RDI;
  string temp;
  iterator end;
  iterator last;
  iterator begin;
  iterator iter;
  Unicode _unicode;
  uint16_t index;
  trie_node_t *node;
  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
  *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  const_iterator in_stack_ffffffffffffff08;
  const_iterator in_stack_ffffffffffffff10;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff38;
  map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
  *in_stack_ffffffffffffff40;
  _Self local_a0;
  _Self local_98;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_90 [4];
  unsigned_short *local_70;
  unsigned_short *local_68;
  unsigned_short *local_60;
  unsigned_short *local_58 [6];
  unsigned_short local_22;
  mapped_type local_20;
  
  local_20 = *(mapped_type *)(in_RDI + 0x38);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x116c5a);
  CppJieba::TransCode::decode
            (in_stack_ffffffffffffff00,
             (vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_stack_fffffffffffffef8);
  local_68 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffef8);
  local_60 = local_68;
  local_58[0] = local_68;
  local_70 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                        in_stack_fffffffffffffef8);
  std::__cxx11::string::string((string *)local_90);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff00,
                       (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_90);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 in_stack_ffffffffffffff10._M_current);
      return true;
    }
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                          *)local_58);
    local_22 = *puVar2;
    for (; local_20 != (mapped_type)0x0; local_20 = local_20->search_clue) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
           ::find(in_stack_fffffffffffffef8,(key_type *)0x116d3a);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
           ::end(in_stack_fffffffffffffef8);
      bVar1 = std::operator==(&local_98,&local_a0);
      if (!bVar1) {
        in_stack_ffffffffffffff10._M_current =
             (unsigned_short *)
             std::
             map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
             ::operator[](in_stack_ffffffffffffff40,in_stack_ffffffffffffff38._M_current);
        local_20 = *(mapped_type *)in_stack_ffffffffffffff10._M_current;
        break;
      }
    }
    if (local_20 == (mapped_type)0x0) {
      local_20 = *(mapped_type *)(in_RDI + 0x38);
    }
    else if (local_20->infoIndex != -1) {
      in_stack_ffffffffffffff08._M_current = (unsigned_short *)local_90;
      std::__cxx11::string::clear();
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x20),
                 (long)local_20->infoIndex);
      in_stack_fffffffffffffef8 =
           (map<unsigned_short,_trie_node_s_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_trie_node_s_*>_>_>
            *)local_58;
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator-((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                   *)in_stack_ffffffffffffff08._M_current,(difference_type)in_stack_ffffffffffffff00
                 );
      in_stack_ffffffffffffff00 = (string *)0x1;
      local_68 = (unsigned_short *)
                 __gnu_cxx::
                 __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                 ::operator+(in_stack_ffffffffffffff08._M_current,1);
      __gnu_cxx::
      __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
      ::__normal_iterator<unsigned_short*>
                ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_ffffffffffffff00,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff38 =
           __gnu_cxx::
           __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
           ::operator+(in_stack_ffffffffffffff08._M_current,
                       (difference_type)in_stack_ffffffffffffff00);
      __gnu_cxx::
      __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
      ::__normal_iterator<unsigned_short*>
                ((__normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_ffffffffffffff00,
                 (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_fffffffffffffef8);
      CppJieba::TransCode::encode
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_ffffffffffffff10._M_current,
                  (value_type *)in_stack_ffffffffffffff08._M_current);
    }
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *)in_stack_ffffffffffffff08._M_current,
                 (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  } while( true );
}

Assistant:

bool Trie::matchAll(const string &src, vector<string> &outVect)
{
	trie_node_t *node = root;
	uint16_t index;
    Unicode _unicode;
	decode(src, _unicode);
	auto iter = _unicode.begin();
	auto begin = iter, last = iter;
	auto end = _unicode.end();
	string temp;
    for( ; iter != end; iter++ ) {
		index = *iter;
		for ( ; ; ) {
			if ( node == NULL ) {
				break;
			} else if ( node->nextMap.find(index) == node->nextMap.end() ) {
			    node = node->search_clue;
			} else {
				node = node->nextMap[index];
				break;
			}
		}
	    if ( node == NULL ) {
			node = root;
		} else	{
			if ( node->infoIndex != -1 ) {
				temp.clear();
				last = iter - lengthVect[node->infoIndex] + 1;
                encode(last, iter+1 , temp);
                outVect.push_back(temp);
			}
		}
	}
	return true;
}